

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O1

int __thiscall
btTriangleMesh::findOrAddVertex(btTriangleMesh *this,btVector3 *vertex,bool removeDuplicateVertices)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  btVector3 *ptr;
  float *pfVar4;
  btIndexedMesh *pbVar5;
  undefined8 uVar6;
  int in_EAX;
  int iVar7;
  ulong uVar8;
  btVector3 *pbVar9;
  float *pfVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  btScalar *pbVar15;
  int iVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  if (this->m_use4componentVertices == true) {
    if (removeDuplicateVertices) {
      uVar13 = (ulong)(this->m_4componentVertices).m_size;
      bVar17 = 0 < (long)uVar13;
      if (0 < (long)uVar13) {
        pbVar9 = (this->m_4componentVertices).m_data;
        fVar18 = pbVar9->m_floats[0] - vertex->m_floats[0];
        fVar19 = pbVar9->m_floats[1] - vertex->m_floats[1];
        fVar20 = pbVar9->m_floats[2] - vertex->m_floats[2];
        uVar8 = 0;
        if (this->m_weldingThreshold < fVar20 * fVar20 + fVar18 * fVar18 + fVar19 * fVar19) {
          pbVar15 = pbVar9[1].m_floats + 2;
          uVar8 = 0;
          do {
            if (uVar13 - 1 == uVar8) goto LAB_0016ed66;
            fVar18 = ((btVector3 *)(pbVar15 + -2))->m_floats[0] - vertex->m_floats[0];
            fVar19 = pbVar15[-1] - vertex->m_floats[1];
            fVar20 = *pbVar15 - vertex->m_floats[2];
            pbVar15 = pbVar15 + 4;
            uVar8 = uVar8 + 1;
          } while (this->m_weldingThreshold < fVar20 * fVar20 + fVar18 * fVar18 + fVar19 * fVar19);
          bVar17 = uVar8 < uVar13;
        }
        if (bVar17) {
          return (int)uVar8;
        }
      }
    }
LAB_0016ed66:
    piVar1 = &((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_numVertices;
    *piVar1 = *piVar1 + 1;
    iVar12 = (this->m_4componentVertices).m_size;
    iVar7 = (this->m_4componentVertices).m_capacity;
    if (iVar12 == iVar7) {
      iVar16 = 1;
      if (iVar12 != 0) {
        iVar16 = iVar12 * 2;
      }
      if (iVar7 < iVar16) {
        if (iVar16 == 0) {
          pbVar9 = (btVector3 *)0x0;
        }
        else {
          pbVar9 = (btVector3 *)btAlignedAllocInternal((long)iVar16 << 4,0x10);
        }
        lVar11 = (long)(this->m_4componentVertices).m_size;
        if (0 < lVar11) {
          lVar14 = 0;
          do {
            puVar2 = (undefined8 *)((long)((this->m_4componentVertices).m_data)->m_floats + lVar14);
            uVar6 = puVar2[1];
            puVar3 = (undefined8 *)((long)pbVar9->m_floats + lVar14);
            *puVar3 = *puVar2;
            puVar3[1] = uVar6;
            lVar14 = lVar14 + 0x10;
          } while (lVar11 * 0x10 != lVar14);
        }
        ptr = (this->m_4componentVertices).m_data;
        if (ptr != (btVector3 *)0x0) {
          if ((this->m_4componentVertices).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr);
          }
          (this->m_4componentVertices).m_data = (btVector3 *)0x0;
        }
        (this->m_4componentVertices).m_ownsMemory = true;
        (this->m_4componentVertices).m_data = pbVar9;
        (this->m_4componentVertices).m_capacity = iVar16;
      }
    }
    uVar6 = *(undefined8 *)(vertex->m_floats + 2);
    pbVar9 = (this->m_4componentVertices).m_data + (this->m_4componentVertices).m_size;
    *(undefined8 *)pbVar9->m_floats = *(undefined8 *)vertex->m_floats;
    *(undefined8 *)(pbVar9->m_floats + 2) = uVar6;
    iVar12 = (this->m_4componentVertices).m_size;
    (this->m_4componentVertices).m_size = iVar12 + 1;
    ((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_vertexBase =
         (uchar *)(this->m_4componentVertices).m_data;
  }
  else {
    if (removeDuplicateVertices) {
      iVar12 = (this->m_3componentVertices).m_size;
      bVar17 = 0 < iVar12;
      iVar7 = in_EAX;
      if (0 < iVar12) {
        pfVar10 = (this->m_3componentVertices).m_data;
        iVar16 = 0;
        lVar11 = 0;
        do {
          fVar18 = pfVar10[lVar11] - vertex->m_floats[0];
          fVar19 = pfVar10[lVar11 + 1] - vertex->m_floats[1];
          fVar20 = pfVar10[lVar11 + 2] - vertex->m_floats[2];
          iVar7 = iVar16;
          if (fVar20 * fVar20 + fVar18 * fVar18 + fVar19 * fVar19 <= this->m_weldingThreshold)
          break;
          lVar11 = lVar11 + 3;
          iVar16 = iVar16 + 1;
          bVar17 = (int)lVar11 < iVar12;
          iVar7 = in_EAX;
        } while ((int)lVar11 < iVar12);
      }
      if (bVar17) {
        return iVar7;
      }
    }
    iVar12 = (this->m_3componentVertices).m_size;
    iVar7 = (this->m_3componentVertices).m_capacity;
    if (iVar12 == iVar7) {
      iVar16 = 1;
      if (iVar12 != 0) {
        iVar16 = iVar12 * 2;
      }
      if (iVar7 < iVar16) {
        if (iVar16 == 0) {
          pfVar10 = (float *)0x0;
        }
        else {
          pfVar10 = (float *)btAlignedAllocInternal((long)iVar16 << 2,0x10);
        }
        lVar11 = (long)(this->m_3componentVertices).m_size;
        if (0 < lVar11) {
          pfVar4 = (this->m_3componentVertices).m_data;
          lVar14 = 0;
          do {
            pfVar10[lVar14] = pfVar4[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar11 != lVar14);
        }
        pfVar4 = (this->m_3componentVertices).m_data;
        if (pfVar4 != (float *)0x0) {
          if ((this->m_3componentVertices).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar4);
          }
          (this->m_3componentVertices).m_data = (float *)0x0;
        }
        (this->m_3componentVertices).m_ownsMemory = true;
        (this->m_3componentVertices).m_data = pfVar10;
        (this->m_3componentVertices).m_capacity = iVar16;
      }
    }
    iVar12 = (this->m_3componentVertices).m_size;
    (this->m_3componentVertices).m_data[iVar12] = vertex->m_floats[0];
    iVar12 = iVar12 + 1;
    (this->m_3componentVertices).m_size = iVar12;
    iVar7 = (this->m_3componentVertices).m_capacity;
    if (iVar12 == iVar7) {
      iVar16 = 1;
      if (iVar12 != 0) {
        iVar16 = iVar12 * 2;
      }
      if (iVar7 < iVar16) {
        if (iVar16 == 0) {
          pfVar10 = (float *)0x0;
        }
        else {
          pfVar10 = (float *)btAlignedAllocInternal((long)iVar16 << 2,0x10);
        }
        lVar11 = (long)(this->m_3componentVertices).m_size;
        if (0 < lVar11) {
          pfVar4 = (this->m_3componentVertices).m_data;
          lVar14 = 0;
          do {
            pfVar10[lVar14] = pfVar4[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar11 != lVar14);
        }
        pfVar4 = (this->m_3componentVertices).m_data;
        if (pfVar4 != (float *)0x0) {
          if ((this->m_3componentVertices).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar4);
          }
          (this->m_3componentVertices).m_data = (float *)0x0;
        }
        (this->m_3componentVertices).m_ownsMemory = true;
        (this->m_3componentVertices).m_data = pfVar10;
        (this->m_3componentVertices).m_capacity = iVar16;
      }
    }
    iVar12 = (this->m_3componentVertices).m_size;
    (this->m_3componentVertices).m_data[iVar12] = vertex->m_floats[1];
    iVar12 = iVar12 + 1;
    (this->m_3componentVertices).m_size = iVar12;
    iVar7 = (this->m_3componentVertices).m_capacity;
    if (iVar12 == iVar7) {
      iVar16 = 1;
      if (iVar12 != 0) {
        iVar16 = iVar12 * 2;
      }
      if (iVar7 < iVar16) {
        if (iVar16 == 0) {
          pfVar10 = (float *)0x0;
        }
        else {
          pfVar10 = (float *)btAlignedAllocInternal((long)iVar16 << 2,0x10);
        }
        lVar11 = (long)(this->m_3componentVertices).m_size;
        if (0 < lVar11) {
          pfVar4 = (this->m_3componentVertices).m_data;
          lVar14 = 0;
          do {
            pfVar10[lVar14] = pfVar4[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar11 != lVar14);
        }
        pfVar4 = (this->m_3componentVertices).m_data;
        if (pfVar4 != (float *)0x0) {
          if ((this->m_3componentVertices).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar4);
          }
          (this->m_3componentVertices).m_data = (float *)0x0;
        }
        (this->m_3componentVertices).m_ownsMemory = true;
        (this->m_3componentVertices).m_data = pfVar10;
        (this->m_3componentVertices).m_capacity = iVar16;
      }
    }
    pfVar10 = (this->m_3componentVertices).m_data;
    iVar12 = (this->m_3componentVertices).m_size;
    pfVar10[iVar12] = vertex->m_floats[2];
    iVar12 = iVar12 + 1;
    (this->m_3componentVertices).m_size = iVar12;
    pbVar5 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
    piVar1 = &pbVar5->m_numVertices;
    *piVar1 = *piVar1 + 1;
    pbVar5->m_vertexBase = (uchar *)pfVar10;
    iVar12 = iVar12 / 3 + -1;
  }
  return iVar12;
}

Assistant:

int	btTriangleMesh::findOrAddVertex(const btVector3& vertex, bool removeDuplicateVertices)
{
	//return index of new/existing vertex
	///@todo: could use acceleration structure for this
	if (m_use4componentVertices)
	{
		if (removeDuplicateVertices)
			{
			for (int i=0;i< m_4componentVertices.size();i++)
			{
				if ((m_4componentVertices[i]-vertex).length2() <= m_weldingThreshold)
				{
					return i;
				}
			}
		}
		m_indexedMeshes[0].m_numVertices++;
		m_4componentVertices.push_back(vertex);
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_4componentVertices[0];

		return m_4componentVertices.size()-1;
		
	} else
	{
		
		if (removeDuplicateVertices)
		{
			for (int i=0;i< m_3componentVertices.size();i+=3)
			{
				btVector3 vtx(m_3componentVertices[i],m_3componentVertices[i+1],m_3componentVertices[i+2]);
				if ((vtx-vertex).length2() <= m_weldingThreshold)
				{
					return i/3;
				}
			}
		}
		m_3componentVertices.push_back(vertex.getX());
		m_3componentVertices.push_back(vertex.getY());
		m_3componentVertices.push_back(vertex.getZ());
		m_indexedMeshes[0].m_numVertices++;
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_3componentVertices[0];
		return (m_3componentVertices.size()/3)-1;
	}

}